

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void sendfile_nodata_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req == &sendfile_req) {
    if (sendfile_req.fs_type == UV_FS_SENDFILE) {
      if (sendfile_req.result == 0) {
        sendfile_cb_count = sendfile_cb_count + 1;
        uv_fs_req_cleanup(&sendfile_req);
        return;
      }
      pcVar2 = "req->result == 0";
      uVar1 = 0x2ad;
    }
    else {
      pcVar2 = "req->fs_type == UV_FS_SENDFILE";
      uVar1 = 0x2ac;
    }
  }
  else {
    pcVar2 = "req == &sendfile_req";
    uVar1 = 0x2ab;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar1,pcVar2);
  abort();
}

Assistant:

static void sendfile_nodata_cb(uv_fs_t* req) {
  ASSERT(req == &sendfile_req);
  ASSERT(req->fs_type == UV_FS_SENDFILE);
  ASSERT(req->result == 0);
  sendfile_cb_count++;
  uv_fs_req_cleanup(req);
}